

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12extend.c
# Opt level: O1

void aom_yv12_partial_copy_y_c
               (YV12_BUFFER_CONFIG *src_ybc,int hstart1,int hend1,int vstart1,int vend1,
               YV12_BUFFER_CONFIG *dst_ybc,int hstart2,int vstart2)

{
  int iVar1;
  uint8_t *__dest;
  void *__dest_00;
  uint8_t *__src;
  void *__src_00;
  
  if ((src_ybc->flags & 8) == 0) {
    iVar1 = vend1 - vstart1;
    if (iVar1 != 0 && vstart1 <= vend1) {
      __dest = (dst_ybc->field_5).buffers[0] +
               (long)vstart2 * (long)(dst_ybc->field_4).field_0.y_stride + (long)hstart2;
      __src = (src_ybc->field_5).buffers[0] +
              (long)vstart1 * (long)(src_ybc->field_4).field_0.y_stride + (long)hstart1;
      do {
        memcpy(__dest,__src,(long)(hend1 - hstart1));
        __src = __src + (src_ybc->field_4).field_0.y_stride;
        __dest = __dest + (dst_ybc->field_4).field_0.y_stride;
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
    }
  }
  else {
    iVar1 = vend1 - vstart1;
    if (iVar1 != 0 && vstart1 <= vend1) {
      __dest_00 = (void *)((long)((dst_ybc->field_5).buffers[0] +
                                 (long)vstart2 * (long)(dst_ybc->field_4).field_0.y_stride +
                                 (long)hstart2) * 2);
      __src_00 = (void *)((long)((src_ybc->field_5).buffers[0] +
                                (long)vstart1 * (long)(src_ybc->field_4).field_0.y_stride +
                                (long)hstart1) * 2);
      do {
        memcpy(__dest_00,__src_00,(long)(hend1 - hstart1) * 2);
        __src_00 = (void *)((long)__src_00 + (long)(src_ybc->field_4).field_0.y_stride * 2);
        __dest_00 = (void *)((long)__dest_00 + (long)(dst_ybc->field_4).field_0.y_stride * 2);
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
    }
  }
  return;
}

Assistant:

void aom_yv12_partial_copy_y_c(const YV12_BUFFER_CONFIG *src_ybc, int hstart1,
                               int hend1, int vstart1, int vend1,
                               YV12_BUFFER_CONFIG *dst_ybc, int hstart2,
                               int vstart2) {
  int row;
  const uint8_t *src = src_ybc->y_buffer;
  uint8_t *dst = dst_ybc->y_buffer;
#if CONFIG_AV1_HIGHBITDEPTH
  if (src_ybc->flags & YV12_FLAG_HIGHBITDEPTH) {
    const uint16_t *src16 =
        CONVERT_TO_SHORTPTR(src + vstart1 * src_ybc->y_stride + hstart1);
    uint16_t *dst16 =
        CONVERT_TO_SHORTPTR(dst + vstart2 * dst_ybc->y_stride + hstart2);

    for (row = vstart1; row < vend1; ++row) {
      memcpy(dst16, src16, (hend1 - hstart1) * sizeof(uint16_t));
      src16 += src_ybc->y_stride;
      dst16 += dst_ybc->y_stride;
    }
    return;
  }
#endif
  src = (src + vstart1 * src_ybc->y_stride + hstart1);
  dst = (dst + vstart2 * dst_ybc->y_stride + hstart2);

  for (row = vstart1; row < vend1; ++row) {
    memcpy(dst, src, (hend1 - hstart1));
    src += src_ybc->y_stride;
    dst += dst_ybc->y_stride;
  }
}